

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interface_ProblemToPolicyDiscretePure.h
# Opt level: O0

LIndex __thiscall
Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies
          (Interface_ProblemToPolicyDiscretePure *this,PolicyDomainCategory cat,size_t depth)

{
  EOverflow *this_00;
  EOverflow *pEVar1;
  LIndex LVar2;
  char *arg;
  undefined8 in_RDX;
  undefined4 in_ESI;
  long *in_RDI;
  LIndex nOld;
  Index ag;
  LIndex n;
  uint local_24;
  ulong depth_00;
  ulong uVar3;
  undefined4 in_stack_fffffffffffffff0;
  
  local_24 = 0;
  depth_00 = 1;
  while( true ) {
    this_00 = (EOverflow *)(ulong)local_24;
    pEVar1 = (EOverflow *)(**(code **)(*in_RDI + 0x18))();
    if (pEVar1 <= this_00) {
      return depth_00;
    }
    uVar3 = depth_00;
    LVar2 = GetNrPolicies((Interface_ProblemToPolicyDiscretePure *)
                          CONCAT44(in_ESI,in_stack_fffffffffffffff0),(Index)((ulong)in_RDX >> 0x20),
                          (PolicyDomainCategory)in_RDX,depth_00);
    if (LVar2 * uVar3 < depth_00) break;
    local_24 = local_24 + 1;
    depth_00 = LVar2 * uVar3;
  }
  arg = (char *)__cxa_allocate_exception(0x28);
  EOverflow::EOverflow(this_00,arg);
  __cxa_throw(arg,&EOverflow::typeinfo,EOverflow::~EOverflow);
}

Assistant:

LIndex GetNrJointPolicies(PolicyGlobals::PolicyDomainCategory cat, 
                                  size_t depth=MAXHORIZON) const
        {
            LIndex n=1;
            for(Index ag=0; ag < GetNrAgents(); ag++)
            {
                LIndex nOld=n;
                n *= GetNrPolicies(ag,cat,depth);
                if(n<nOld)
                    throw(EOverflow("Interface_ProblemToPolicyDiscretePure::GetNrJointPolicies() overflow detected"));
            }

            return(n);
        }